

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderDepth(xmlTextReaderPtr reader)

{
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (reader->node == (xmlNodePtr)0x0) {
    return 0;
  }
  if (reader->curnode == (xmlNodePtr)0x0) {
    return reader->depth;
  }
  if ((reader->curnode->type | XML_ATTRIBUTE_DECL) == XML_NAMESPACE_DECL) {
    return reader->depth + 1;
  }
  return reader->depth + 2;
}

Assistant:

int
xmlTextReaderDepth(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);

    if (reader->curnode != NULL) {
	if ((reader->curnode->type == XML_ATTRIBUTE_NODE) ||
	    (reader->curnode->type == XML_NAMESPACE_DECL))
	    return(reader->depth + 1);
	return(reader->depth + 2);
    }
    return(reader->depth);
}